

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void print_fastq_seq(kseq_t *seq)

{
  int iVar1;
  size_t sVar2;
  void *__ptr;
  int local_1c;
  int l;
  int i;
  char *qual_str;
  kseq_t *seq_local;
  
  sVar2 = strlen((seq->seq).s);
  iVar1 = (int)sVar2 + 1;
  if ((seq->qual).s == (char *)0x0) {
    __ptr = malloc((long)iVar1);
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      *(char *)((long)__ptr + (long)local_1c) = (char)QUALITY_SCORE;
    }
    *(undefined1 *)((long)__ptr + (long)(int)sVar2) = 0;
    if ((seq->comment).l == 0) {
      printf("@%s\n%s\n+\n%s\n",(seq->name).s,(seq->seq).s,__ptr);
    }
    else {
      printf("@%s %s\n%s\n+\n%s\n",(seq->name).s,(seq->comment).s,(seq->seq).s,__ptr);
    }
    free(__ptr);
  }
  else if ((seq->comment).l == 0) {
    printf("@%s\n%s\n+\n%s\n",(seq->name).s,(seq->seq).s,(seq->qual).s);
  }
  else {
    printf("@%s %s\n%s\n+\n%s\n",(seq->name).s,(seq->comment).s,(seq->seq).s,(seq->qual).s);
  }
  return;
}

Assistant:

void print_fastq_seq(kseq_t *seq)
{
	char *qual_str = NULL;
	int i=0;
	int l=strlen(seq->seq.s) + 1;     /* sequence length */
	if (seq->qual.s == NULL) {        /* just use a default value for the quality code */
		qual_str = (char *)malloc(sizeof(char) * l);
		for (i=0;i<l;i++) {
			qual_str[i] = (char)QUALITY_SCORE; /* set the value to char '=', ASCII 61 */
		}
		qual_str[l - 1] = '\0'; /* terminate the string */

		if (seq->comment.l == 0)
			printf("@%s\n%s\n+\n%s\n", seq->name.s, seq->seq.s, qual_str);
		else
			printf("@%s %s\n%s\n+\n%s\n", seq->name.s, seq->comment.s, seq->seq.s, qual_str);

		free(qual_str);
	} else {
		if (seq->comment.l == 0)
			printf("@%s\n%s\n+\n%s\n",seq->name.s,seq->seq.s,seq->qual.s);
		else
			printf("@%s %s\n%s\n+\n%s\n",seq->name.s,seq->comment.s,seq->seq.s,seq->qual.s);
	}
}